

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleImageTests.cpp
# Opt level: O1

void vkt::pipeline::anon_unknown_0::StorageImage::initPrograms
               (SourceCollections *programCollection,CaseDef *caseDef)

{
  size_type *psVar1;
  int iVar2;
  bool bVar3;
  TextureChannelClass TVar4;
  TextureFormat TVar5;
  size_t sVar6;
  ostream *poVar7;
  long *plVar8;
  ProgramSources *pPVar9;
  long *plVar10;
  char *pcVar11;
  char *__s;
  string formatPart;
  string texelCoordStr;
  string gvec4Expr;
  string formatQualifierStr;
  string signednessPrefix;
  string imageTypeStr;
  ostringstream src;
  size_type *local_2c8;
  value_type local_2c0;
  long *local_2a0;
  long local_298;
  long local_290 [2];
  long *local_280;
  long local_278;
  long local_270 [2];
  long *local_260;
  long local_258;
  long local_250;
  long lStack_248;
  long *local_240;
  long local_238;
  long local_230 [2];
  long *local_220;
  long local_218;
  long local_210 [2];
  string local_200;
  long *local_1e0;
  long local_1d8;
  long local_1d0 [2];
  long *local_1c0;
  long local_1b8;
  long local_1b0;
  long lStack_1a8;
  ios_base local_150 [264];
  CaseDef local_48;
  
  local_48.renderSize.m_data = *&(caseDef->renderSize).m_data;
  local_48.numLayers = caseDef->numLayers;
  local_48.colorFormat = caseDef->colorFormat;
  local_48.numSamples = caseDef->numSamples;
  addSimpleVertexAndFragmentPrograms(programCollection,&local_48);
  TVar5 = ::vk::mapVkFormat(caseDef->colorFormat);
  iVar2 = caseDef->numLayers;
  TVar4 = tcu::getTextureChannelClass(TVar5.type);
  if (TVar4 == TEXTURECHANNELCLASS_UNSIGNED_INTEGER) {
    pcVar11 = "u";
  }
  else {
    TVar4 = tcu::getTextureChannelClass(TVar5.type);
    pcVar11 = "";
    if (TVar4 == TEXTURECHANNELCLASS_SIGNED_INTEGER) {
      pcVar11 = "i";
    }
  }
  psVar1 = &local_2c0._M_string_length;
  local_2c8 = psVar1;
  sVar6 = strlen(pcVar11);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,pcVar11,pcVar11 + sVar6);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_1c0,(char *)local_2c8,(long)local_2c0._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"image2DMS",9);
  pcVar11 = "Array";
  __s = "";
  if (iVar2 < 2) {
    pcVar11 = "";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar11,(ulong)(1 < iVar2) * 5);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1c0);
  std::ios_base::~ios_base(local_150);
  if (local_2c8 != psVar1) {
    operator_delete(local_2c8,
                    CONCAT71(local_2c0._M_string_length._1_7_,(undefined1)local_2c0._M_string_length
                            ) + 1);
  }
  TVar5 = ::vk::mapVkFormat(caseDef->colorFormat);
  switch(TVar5.type) {
  case SIGNED_INT8:
    break;
  case SIGNED_INT16:
    break;
  case SIGNED_INT32:
    break;
  case UNSIGNED_INT8:
    break;
  case UNSIGNED_INT16:
    break;
  case UNSIGNED_INT32:
    break;
  case HALF_FLOAT:
    break;
  case FLOAT:
    break;
  default:
    if (TVar5.type < UNORM_INT24) {
      (*(code *)(&DAT_00b15310 + *(int *)(&DAT_00b15310 + ((ulong)TVar5 >> 0x20) * 4)))();
      return;
    }
  case UNSIGNED_INT24:
  }
  local_2c0._M_dataplus._M_p = (pointer)0x0;
  local_2c0._M_string_length._0_1_ = 0;
  local_2c8 = psVar1;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_2c8);
  plVar10 = plVar8 + 2;
  if ((long *)*plVar8 == plVar10) {
    local_1b0 = *plVar10;
    lStack_1a8 = plVar8[3];
    local_1c0 = &local_1b0;
  }
  else {
    local_1b0 = *plVar10;
    local_1c0 = (long *)*plVar8;
  }
  local_1b8 = plVar8[1];
  *plVar8 = (long)plVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_1c0);
  plVar10 = plVar8 + 2;
  if ((long *)*plVar8 == plVar10) {
    local_250 = *plVar10;
    lStack_248 = plVar8[3];
    local_260 = &local_250;
  }
  else {
    local_250 = *plVar10;
    local_260 = (long *)*plVar8;
  }
  local_258 = plVar8[1];
  *plVar8 = (long)plVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if (local_1c0 != &local_1b0) {
    operator_delete(local_1c0,local_1b0 + 1);
  }
  if (local_2c8 != psVar1) {
    operator_delete(local_2c8,
                    CONCAT71(local_2c0._M_string_length._1_7_,(undefined1)local_2c0._M_string_length
                            ) + 1);
  }
  bVar3 = ::vk::isUintFormat(caseDef->colorFormat);
  if (bVar3) {
    __s = "u";
  }
  else {
    bVar3 = ::vk::isIntFormat(caseDef->colorFormat);
    if (bVar3) {
      __s = "i";
    }
  }
  local_240 = local_230;
  sVar6 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,__s,__s + sVar6);
  local_280 = local_270;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_280,local_240,local_238 + (long)local_240);
  std::__cxx11::string::append((char *)&local_280);
  bVar3 = caseDef->numLayers != 1;
  pcVar11 = "ivec3(gx, gy, gz)";
  if (!bVar3) {
    pcVar11 = "ivec2(gx, gy)";
  }
  local_2a0 = local_290;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2a0,pcVar11,pcVar11 + (ulong)bVar3 * 4 + 0xd);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0);
  pcVar11 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  if (pcVar11 == (char *)0x0) {
    std::ios::clear((int)&local_2c8 + (int)local_1c0[-3] + 0x108);
  }
  else {
    sVar6 = strlen(pcVar11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c0,pcVar11,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c0,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1c0,"layout(local_size_x = 1) in;\n",0x1d);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1c0,"layout(set = 0, binding = 0, ",0x1d);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_1c0,(char *)local_260,local_258);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,") uniform ",10);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_1e0,local_1d8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," u_msImage;\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"void main(void)\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"    int gx = int(gl_GlobalInvocationID.x);\n",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"    int gy = int(gl_GlobalInvocationID.y);\n",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"    int gz = int(gl_GlobalInvocationID.z);\n",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"    ",4);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_280,local_278);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7," prevColor = imageLoad(u_msImage, ",0x22);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_2a0,local_298);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,", 0);\n",6);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"    for (int sampleNdx = 1; sampleNdx < ",0x28);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,caseDef->numSamples);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"; ++sampleNdx) {\n",0x11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"        ",8);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_280,local_278);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," color = imageLoad(u_msImage, ",0x1e);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_2a0,local_298);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,", sampleNdx);\n",0xe);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"        imageStore(u_msImage, ",0x1e);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_2a0,local_298);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,", sampleNdx, prevColor);\n",0x19);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"        prevColor = color;\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"    }\n",6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"    imageStore(u_msImage, ",0x1a);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_2a0,local_298);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,", 0, prevColor);\n",0x11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}\n",2);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"comp","");
  pPVar9 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_200);
  std::__cxx11::stringbuf::str();
  local_2c8 = (size_type *)CONCAT44(local_2c8._4_4_,5);
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2c0,local_220,local_218 + (long)local_220);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar9->sources + ((ulong)local_2c8 & 0xffffffff),&local_2c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  if (local_220 != local_210) {
    operator_delete(local_220,local_210[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1c0);
  std::ios_base::~ios_base(local_150);
  if (local_2a0 != local_290) {
    operator_delete(local_2a0,local_290[0] + 1);
  }
  if (local_280 != local_270) {
    operator_delete(local_280,local_270[0] + 1);
  }
  if (local_240 != local_230) {
    operator_delete(local_240,local_230[0] + 1);
  }
  if (local_260 != &local_250) {
    operator_delete(local_260,local_250 + 1);
  }
  if (local_1e0 != local_1d0) {
    operator_delete(local_1e0,local_1d0[0] + 1);
  }
  return;
}

Assistant:

void initPrograms (SourceCollections& programCollection, const CaseDef caseDef)
{
	// Vertex & fragment

	addSimpleVertexAndFragmentPrograms(programCollection, caseDef);

	// Compute
	{
		const std::string	imageTypeStr		= getShaderMultisampledImageType(mapVkFormat(caseDef.colorFormat), caseDef.numLayers);
		const std::string	formatQualifierStr	= getShaderImageFormatQualifier(mapVkFormat(caseDef.colorFormat));
		const std::string	signednessPrefix	= isUintFormat(caseDef.colorFormat) ? "u" : isIntFormat(caseDef.colorFormat) ? "i" : "";
		const std::string	gvec4Expr			= signednessPrefix + "vec4";
		const std::string	texelCoordStr		= (caseDef.numLayers == 1 ? "ivec2(gx, gy)" : "ivec3(gx, gy, gz)");

		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "layout(local_size_x = 1) in;\n"
			<< "layout(set = 0, binding = 0, " << formatQualifierStr << ") uniform " << imageTypeStr << " u_msImage;\n"
			<< "\n"
			<< "void main(void)\n"
			<< "{\n"
			<< "    int gx = int(gl_GlobalInvocationID.x);\n"
			<< "    int gy = int(gl_GlobalInvocationID.y);\n"
			<< "    int gz = int(gl_GlobalInvocationID.z);\n"
			<< "\n"
			<< "    " << gvec4Expr << " prevColor = imageLoad(u_msImage, " << texelCoordStr << ", 0);\n"
			<< "    for (int sampleNdx = 1; sampleNdx < " << caseDef.numSamples << "; ++sampleNdx) {\n"
			<< "        " << gvec4Expr << " color = imageLoad(u_msImage, " << texelCoordStr << ", sampleNdx);\n"
			<< "        imageStore(u_msImage, " << texelCoordStr <<", sampleNdx, prevColor);\n"
			<< "        prevColor = color;\n"
			<< "    }\n"
			<< "    imageStore(u_msImage, " << texelCoordStr <<", 0, prevColor);\n"
			<< "}\n";

		programCollection.glslSources.add("comp") << glu::ComputeSource(src.str());
	}
}